

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  XmlFormatting XVar4;
  AssertionResult *this_00;
  element_type *peVar5;
  string *psVar6;
  XmlWriter *pXVar7;
  byte local_379;
  string local_378;
  SourceLineInfo local_358;
  allocator<char> local_341;
  string local_340;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [16];
  string local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  allocator<char> local_291;
  string local_290;
  string local_270;
  SourceLineInfo local_250;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0 [32];
  undefined1 local_1d0 [16];
  string local_1c0;
  allocator<char> local_199;
  string local_198 [32];
  undefined1 local_178 [16];
  SourceLineInfo local_168;
  StringRef local_158;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [40];
  string local_80 [32];
  undefined1 local_60 [24];
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  bool includeResults;
  AssertionResult *result;
  AssertionStats *assertionStats_local;
  XmlReporter *this_local;
  
  this_00 = &assertionStats->assertionResult;
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
  uVar2 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[5])();
  local_379 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(this_00);
    local_379 = bVar1 ^ 0xff;
  }
  local_379 = local_379 & 1;
  if ((local_379 != 0) || (OVar3 = AssertionResult::getResultType(this_00), OVar3 == Warning)) {
    __end2 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       (&assertionStats->infoMessages);
    msg = (MessageInfo *)
          clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                    (&assertionStats->infoMessages);
    while (bVar1 = __gnu_cxx::
                   operator==<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                       *)&msg), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_60._16_8_ =
           __gnu_cxx::
           __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
           ::operator*(&__end2);
      if ((((reference)local_60._16_8_)->type == Info) && (local_379 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_80,"Info",(allocator<char> *)(local_a8 + 0x27));
        operator|(Newline,Indent);
        XmlWriter::scopedElement
                  ((XmlWriter *)local_60,(string *)&this->m_xml,(XmlFormatting)local_80);
        psVar6 = (string *)(local_60._16_8_ + 0x10);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_60,psVar6,XVar4);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_60);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)(local_a8 + 0x27));
      }
      else if (((reference)local_60._16_8_)->type == Warning) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_c8,"Warning",&local_c9);
        operator|(Newline,Indent);
        XmlWriter::scopedElement
                  ((XmlWriter *)local_a8,(string *)&this->m_xml,(XmlFormatting)local_c8);
        psVar6 = (string *)(local_60._16_8_ + 0x10);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_a8,psVar6,XVar4);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&__end2);
    }
  }
  if ((local_379 != 0) || (OVar3 = AssertionResult::getResultType(this_00), OVar3 == Warning)) {
    bVar1 = AssertionResult::hasExpression(this_00);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Expression",&local_f1)
      ;
      XVar4 = operator|(Newline,Indent);
      pXVar7 = XmlWriter::startElement(&this->m_xml,&local_f0,XVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"success",&local_119);
      bVar1 = AssertionResult::succeeded(this_00);
      pXVar7 = XmlWriter::writeAttribute(pXVar7,&local_118,bVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"type",&local_141);
      local_158 = AssertionResult::getTestMacroName(this_00);
      XmlWriter::writeAttribute<Catch::StringRef>(pXVar7,&local_140,&local_158);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      local_168 = AssertionResult::getSourceInfo(this_00);
      writeSourceInfo(this,&local_168);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_198,"Original",&local_199);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)local_178,(string *)&this->m_xml,(XmlFormatting)local_198);
      AssertionResult::getExpression_abi_cxx11_((string *)(local_1d0 + 0x10),this_00);
      XVar4 = operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_178,(string *)(local_1d0 + 0x10),XVar4);
      std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1f0,"Expanded",&local_1f1);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)local_1d0,(string *)&this->m_xml,(XmlFormatting)local_1f0);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_218,this_00);
      XVar4 = operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_1d0,&local_218,XVar4);
      std::__cxx11::string::~string((string *)&local_218);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1d0);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
    }
    OVar3 = AssertionResult::getResultType(this_00);
    if (OVar3 == Info) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f8,"Info",&local_2f9);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)local_2d8,(string *)&this->m_xml,(XmlFormatting)local_2f8);
      AssertionResult::getMessage_abi_cxx11_(&local_320,this_00);
      XVar4 = operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_2d8,&local_320,XVar4);
      std::__cxx11::string::~string((string *)&local_320);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2d8);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
    }
    else if (OVar3 != Warning) {
      if (OVar3 == ExplicitFailure) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,"Failure",&local_341);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_340,XVar4);
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator(&local_341);
        local_358 = AssertionResult::getSourceInfo(this_00);
        writeSourceInfo(this,&local_358);
        AssertionResult::getMessage_abi_cxx11_(&local_378,this_00);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,&local_378,XVar4);
        std::__cxx11::string::~string((string *)&local_378);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
      else if (OVar3 == ThrewException) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"Exception",&local_239);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_238,XVar4);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
        local_250 = AssertionResult::getSourceInfo(this_00);
        writeSourceInfo(this,&local_250);
        AssertionResult::getMessage_abi_cxx11_(&local_270,this_00);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,&local_270,XVar4);
        std::__cxx11::string::~string((string *)&local_270);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
      else if (OVar3 == FatalErrorCondition) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"FatalErrorCondition",&local_291);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_290,XVar4);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator(&local_291);
        local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     )AssertionResult::getSourceInfo(this_00);
        writeSourceInfo(this,(SourceLineInfo *)&local_2a8);
        AssertionResult::getMessage_abi_cxx11_((string *)(local_2d8 + 0x10),this_00);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,(string *)(local_2d8 + 0x10),XVar4);
        std::__cxx11::string::~string((string *)(local_2d8 + 0x10));
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
    }
    bVar1 = AssertionResult::hasExpression(this_00);
    if (bVar1) {
      XVar4 = operator|(Newline,Indent);
      XmlWriter::endElement(&this->m_xml,XVar4);
    }
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }